

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qppmhandler.cpp
# Opt level: O0

bool QPpmHandler::canRead(QIODevice *device,QByteArray *subType)

{
  bool bVar1;
  long lVar2;
  QByteArray *in_RSI;
  QMessageLogger *in_RDI;
  long in_FS_OFFSET;
  char head [2];
  QLoggingCategoryMacroHolder<(QtMsgType)1> qt_category;
  QLoggingCategory *in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffa4;
  bool local_41;
  char local_40 [38];
  undefined2 local_1a;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_RDI == (QMessageLogger *)0x0) {
    local_18 = &DAT_aaaaaaaaaaaaaaaa;
    local_10 = &DAT_aaaaaaaaaaaaaaaa;
    QtPrivateLogging::lcImageIo();
    anon_unknown.dwarf_323857::QLoggingCategoryMacroHolder<(QtMsgType)1>::
    QLoggingCategoryMacroHolder
              ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)
               CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
               in_stack_ffffffffffffff98);
    while (bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                             ((QLoggingCategoryMacroHolder *)&local_18), bVar1) {
      anon_unknown.dwarf_323857::QLoggingCategoryMacroHolder<(QtMsgType)1>::name
                ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)0x330f2c);
      QMessageLogger::QMessageLogger
                (in_RDI,(char *)in_RSI,in_stack_ffffffffffffffa4,(char *)in_stack_ffffffffffffff98,
                 (char *)0x330f42);
      QMessageLogger::warning(local_40,"QPpmHandler::canRead() called with no device");
      local_10 = (undefined1 *)((ulong)local_10 & 0xffffffffffffff00);
    }
    local_41 = false;
  }
  else {
    local_1a = 0xaaaa;
    lVar2 = QIODevice::peek((char *)in_RDI,(longlong)&local_1a);
    if (lVar2 == 2) {
      if ((char)local_1a == 'P') {
        if ((local_1a._1_1_ == '1') || (local_1a._1_1_ == '4')) {
          if (in_RSI != (QByteArray *)0x0) {
            QByteArray::operator=(in_RSI,"pbm");
          }
        }
        else if ((local_1a._1_1_ == '2') || (local_1a._1_1_ == '5')) {
          if (in_RSI != (QByteArray *)0x0) {
            QByteArray::operator=(in_RSI,"pgm");
          }
        }
        else {
          if ((local_1a._1_1_ != '3') && (local_1a._1_1_ != '6')) {
            local_41 = false;
            goto LAB_00331047;
          }
          if (in_RSI != (QByteArray *)0x0) {
            QByteArray::operator=(in_RSI,"ppm");
          }
        }
        local_41 = true;
      }
      else {
        local_41 = false;
      }
    }
    else {
      local_41 = false;
    }
  }
LAB_00331047:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_41;
}

Assistant:

bool QPpmHandler::canRead(QIODevice *device, QByteArray *subType)
{
    if (!device) {
        qCWarning(lcImageIo, "QPpmHandler::canRead() called with no device");
        return false;
    }

    char head[2];
    if (device->peek(head, sizeof(head)) != sizeof(head))
        return false;

    if (head[0] != 'P')
        return false;

    if (head[1] == '1' || head[1] == '4') {
        if (subType)
            *subType = "pbm";
    } else if (head[1] == '2' || head[1] == '5') {
        if (subType)
            *subType = "pgm";
    } else if (head[1] == '3' || head[1] == '6') {
        if (subType)
            *subType = "ppm";
    } else {
        return false;
    }
    return true;
}